

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printHelp(string *progName)

{
  ostream *poVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(progName->_M_dataplus)._M_p,progName->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [options]",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  basic user options: ",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"    -h --help   \tshow this message",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    -v --version\tshow version",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "when no options are specified program waits for input of boxes on stdin in the following format: "
             ,0x61);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<n>",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<length of first side of first box> <length of second side of first box> ",0x49
            );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<length of third side of first box>",0x23);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<length of first side of second box> <length of second side of second box> ",
             0x4b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<length of third side of second box>",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"...",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<length of first side of nth box> <length of second side of nth box> ",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<length of third side of nth box>",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"where n is positive integer and the lengths are decimal numbers between ",0x48)
  ;
  poVar1 = std::ostream::_M_insert<double>(0.5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," and ",5);
  poVar1 = std::ostream::_M_insert<double>(1.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Example:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"4",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0.9 0.9 0.9",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0.8 0.8 0.8",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0.7 0.7 0.7",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0.6 0.6 0.6",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "once specifications are given program will calculate the most efficient way to stack those boxes and write "
             ,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"the amount of visible boxes to stdout as a single number",0x38);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  printVersion();
  return;
}

Assistant:

void printHelp(const std::string& progName)
{
	std::cout
		<< "usage: " << progName << " [options]" << std::endl
		<< "  basic user options: " << std::endl
		<< "    -h --help   \tshow this message" << std::endl
		<< "    -v --version\tshow version" << std::endl
		<< std::endl
		<< "when no options are specified program waits for input of boxes on stdin in the following format: "
		<< std::endl
		<< std::endl
		<< "<n>" << std::endl
		<< "<length of first side of first box> <length of second side of first box> "
		<< "<length of third side of first box>" << std::endl
		<< "<length of first side of second box> <length of second side of second box> "
		<< "<length of third side of second box>" << std::endl
		<< "..." << std::endl
		<< "<length of first side of nth box> <length of second side of nth box> "
		<< "<length of third side of nth box>" << std::endl
		<< std::endl
		<< "where n is positive integer and the lengths are decimal numbers between " << BoxNesting::Box::minLength
		<< " and " << BoxNesting::Box::maxLength << std::endl
		<< std::endl
		<< "Example:" << std::endl
		<< "4" << std::endl
		<< "0.9 0.9 0.9" << std::endl
		<< "0.8 0.8 0.8" << std::endl
		<< "0.7 0.7 0.7" << std::endl
		<< "0.6 0.6 0.6" << std::endl
		<< std::endl
		<< "once specifications are given program will calculate the most efficient way to stack those boxes and write "
		<< "the amount of visible boxes to stdout as a single number" << std::endl
		<< std::endl;

	printVersion();
}